

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expFuncMin(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  pointer pEVar1;
  bool bVar2;
  long lVar3;
  anon_union_8_2_b358304e_for_ExpressionValue_1 *paVar4;
  ExpressionValue *result;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  pEVar1 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1;
  if (lVar3 == 0) {
    bVar2 = true;
    dVar6 = NAN;
    dVar7 = 1.79769313486232e+308;
  }
  else {
    dVar5 = NAN;
    lVar3 = (lVar3 >> 4) * -0x5555555555555555;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    paVar4 = &pEVar1->field_1;
    bVar2 = true;
    dVar6 = NAN;
    dVar8 = 1.79769313486232e+308;
    do {
      if (((ExpressionValue *)(paVar4 + -1))->type == Float) {
        dVar7 = paVar4->floatValue;
        bVar2 = false;
      }
      else {
        if (((ExpressionValue *)(paVar4 + -1))->type != Integer) {
          return __return_storage_ptr__;
        }
        dVar5 = (double)paVar4->intValue;
        dVar7 = (double)(long)dVar5;
      }
      if ((long)dVar5 < (long)dVar6) {
        dVar6 = dVar5;
      }
      if (dVar8 <= dVar7) {
        dVar7 = dVar8;
      }
      paVar4 = paVar4 + 6;
      lVar3 = lVar3 + -1;
      dVar8 = dVar7;
    } while (lVar3 != 0);
  }
  if (!bVar2) {
    dVar6 = dVar7;
  }
  (__return_storage_ptr__->field_1).intValue = (int64_t)dVar6;
  __return_storage_ptr__->type = Float - bVar2;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncMin(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	double floatMin, floatCur;
	int64_t intMin, intCur;

	floatCur = floatMin = std::numeric_limits<double>::max();
	intCur = intMin = std::numeric_limits<int64_t>::max();
	bool isInt = true;

	for (size_t i = 0; i < parameters.size(); i++)
	{
		switch (parameters[i].type)
		{
		case ExpressionValueType::Integer:
			intCur = parameters[i].intValue;
			floatCur = (double)parameters[i].intValue;
			break;
		case ExpressionValueType::Float:
			floatCur = parameters[i].floatValue;
			isInt = false;
			break;
		default:
			return result;
		}

		if (intCur < intMin)
			intMin = intCur;
		if (floatCur < floatMin)
			floatMin = floatCur;
	}

	if (isInt)
	{
		result.intValue = intMin;
		result.type = ExpressionValueType::Integer;
	}
	else
	{
		result.floatValue = floatMin;
		result.type = ExpressionValueType::Float;
	}

	return result;
}